

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O0

void Gli_ManStop(Gli_Man_t *p)

{
  Gli_Man_t *p_local;
  
  Vec_IntFree(p->vCis);
  Vec_IntFree(p->vCos);
  Vec_IntFree(p->vCisChanged);
  Vec_IntFree(p->vAffected);
  Vec_IntFree(p->vFrontier);
  if (p->pSimInfoPrev != (uint *)0x0) {
    free(p->pSimInfoPrev);
    p->pSimInfoPrev = (uint *)0x0;
  }
  if (p != (Gli_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Gli_ManStop( Gli_Man_t * p )
{
    Vec_IntFree( p->vCis );
    Vec_IntFree( p->vCos );
    Vec_IntFree( p->vCisChanged );
    Vec_IntFree( p->vAffected );
    Vec_IntFree( p->vFrontier );
    ABC_FREE( p->pSimInfoPrev );
    ABC_FREE( p );
}